

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoShuffle.c
# Opt level: O0

void Extra_ShuffleTest(reo_man *pReo,DdManager *dd,DdNode *Func)

{
  int iVar1;
  int iVar2;
  int iVar3;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  DdNode *bFuncPerm;
  int pOrderInv [1000];
  int pOrder [1000];
  abctime clk;
  int i;
  int Num;
  int OffSet;
  int nSuppSize;
  DdNode *bRemap;
  DdNode *Temp;
  DdNode *Func_local;
  DdManager *dd_local;
  reo_man *pReo_local;
  
  if (999 < dd->size) {
    __assert_fail("dd->size < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoShuffle.c"
                  ,0xa7,"void Extra_ShuffleTest(reo_man *, DdManager *, DdNode *)");
  }
  srand(0x12341234);
  iVar2 = Cudd_SupportSize(dd,Func);
  if (1 < iVar2) {
    for (clk._0_4_ = 0; (int)clk < iVar2; clk._0_4_ = (int)clk + 1) {
      pOrderInv[(long)(int)clk + 0x3e6] = (int)clk;
    }
    for (clk._0_4_ = 0; (int)clk < 0x78; clk._0_4_ = (int)clk + 1) {
      iVar3 = rand();
      iVar3 = iVar3 % (iVar2 + -1);
      iVar1 = pOrderInv[(long)iVar3 + 0x3e6];
      pOrderInv[(long)iVar3 + 0x3e6] = pOrderInv[(long)(iVar3 + 1) + 0x3e6];
      pOrderInv[(long)(iVar3 + 1) + 0x3e6] = iVar1;
    }
    for (clk._0_4_ = 0; (int)clk < iVar2; clk._0_4_ = (int)clk + 1) {
      pOrderInv[(long)pOrderInv[(long)(int)clk + 0x3e6] + -2] = (int)clk;
    }
    n = Extra_bddRemapUp(dd,Func);
    Cudd_Ref(n);
    Abc_Clock();
    n_00 = reoShuffle(pReo,dd,n,pOrderInv + 0x3e6,(int *)&bFuncPerm);
    Cudd_Ref(n_00);
    Abc_Clock();
    n_01 = Cudd_bddPermute(dd,n,(int *)&bFuncPerm);
    Cudd_Ref(n_01);
    if (n_01 != n_00) {
      printf("REO: Internal verification has failed!\n");
      fflush(_stdout);
    }
    Cudd_RecursiveDeref(dd,n_01);
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDeref(dd,n);
  }
  return;
}

Assistant:

void Extra_ShuffleTest( reo_man * pReo, DdManager * dd, DdNode * Func )
{
//    extern int runtime1, runtime2;

	DdNode * Temp, * bRemap;
    int nSuppSize, OffSet, Num, i;
    abctime clk;
	int pOrder[1000], pOrderInv[1000];
    assert( dd->size < 1000 );

    srand( 0x12341234 );
    nSuppSize = Cudd_SupportSize( dd, Func );
    if ( nSuppSize < 2 )
        return;

    for ( i = 0; i < nSuppSize; i++ )
        pOrder[i] = i;
    for ( i = 0; i < 120; i++ )
    {
        OffSet = rand() % (nSuppSize - 1);
        Num = pOrder[OffSet];
        pOrder[OffSet] = pOrder[OffSet+1];
        pOrder[OffSet+1] = Num;
    }
    for ( i = 0; i < nSuppSize; i++ )
        pOrderInv[pOrder[i]] = i;

/*
    printf( "Permutation: " );
    for ( i = 0; i < nSuppSize; i++ )
        printf( "%d ", pOrder[i] );
    printf( "\n" );
    printf( "Inverse permutation: " );
    for ( i = 0; i < nSuppSize; i++ )
        printf( "%d ", pOrderInv[i] );
    printf( "\n" );
*/

    // create permutation
//    Extra_ReorderSetVerification( pReo, 1 );
    bRemap = Extra_bddRemapUp( dd, Func );  Cudd_Ref( bRemap );

clk = Abc_Clock();
	Temp  = reoShuffle( pReo, dd, bRemap, pOrder, pOrderInv );  Cudd_Ref( Temp );
//runtime1 += Abc_Clock() - clk;

//printf( "Initial = %d. Final = %d.\n", Cudd_DagSize(bRemap), Cudd_DagSize(Temp)  );

	{
		DdNode * bFuncPerm;
clk = Abc_Clock();
		bFuncPerm = Cudd_bddPermute( dd, bRemap, pOrderInv );  Cudd_Ref( bFuncPerm );
//runtime2 += Abc_Clock() - clk;
		if ( bFuncPerm != Temp )
		{
			printf( "REO: Internal verification has failed!\n" );
			fflush( stdout );
		}
		Cudd_RecursiveDeref( dd, bFuncPerm );
	}

	Cudd_RecursiveDeref( dd, Temp );
	Cudd_RecursiveDeref( dd, bRemap );
}